

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::NameReader::Read<internal::NameHandler>
          (NameReader *this,CStringRef filename,NameHandler *handler)

{
  size_t size;
  NameHandler *in_R8;
  StringRef data;
  File file;
  File local_1c;
  
  fmt::File::File(&local_1c,filename,0);
  size = fmt::File::size(&local_1c);
  MemoryMappedFile<fmt::File>::map(&this->mapped_file_,&local_1c,size);
  fmt::File::~File(&local_1c);
  data.size_ = (size_t)handler;
  data.data_ = (char *)(this->mapped_file_).super_MemoryMappedFileBase.size_;
  ReadNames<internal::NameHandler>
            ((internal *)filename.data_,
             (CStringRef)(this->mapped_file_).super_MemoryMappedFileBase.start_,data,in_R8);
  return;
}

Assistant:

void Read(fmt::CStringRef filename, NameHandler &handler) {
    try {
      fmt::File file(filename, fmt::File::RDONLY);
      mapped_file_.map(file, filename);
    } catch (...) {
      return;           // ignore if not provided
    }
    fmt::StringRef data(mapped_file_.start(), mapped_file_.size());
    ReadNames(filename, data, handler);
  }